

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTestContiguous.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionTestContiguous::write_cpp
          (InstructionTestContiguous *this,StreamSepMaker *ss,StreamSepMaker *es,
          CppEmitter *cpp_emitter)

{
  pointer pTVar1;
  int iVar2;
  ostream *poVar3;
  StreamSep *this_00;
  StreamSep local_78;
  
  pTVar1 = (this->super_Instruction).next.
           super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
           super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->super_Instruction).next.
            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
            super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar1 == 0x28) {
    StreamSepMaker::operator<<(&local_78,ss,(char (*) [9])0x17de66);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_78.stream,local_78.sep._M_dataplus._M_p,local_78.sep._M_string_length)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    StreamSep::operator<<(&local_78,(char (*) [2])0x17d5c3);
  }
  else {
    if (cpp_emitter->buffer_type == 3) {
      if ((pTVar1[1].inst)->num_ordering == (this->super_Instruction).num_ordering + 1) {
        return;
      }
      StreamSepMaker::operator<<(&local_78,ss,(char (*) [8])0x17df7c);
      iVar2 = Instruction::get_id_gen
                        ((this->super_Instruction).next.
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_78.stream,local_78.sep._M_dataplus._M_p,
                          local_78.sep._M_string_length);
      std::ostream::operator<<((ostream *)poVar3,iVar2);
      StreamSep::operator<<(&local_78,(char (*) [2])0x17d5c3);
      StreamSep::~StreamSep(&local_78);
      return;
    }
    StreamSepMaker::operator<<(&local_78,ss,(char (*) [13])"if ( data + ");
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_78.stream,local_78.sep._M_dataplus._M_p,local_78.sep._M_string_length)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    this_00 = StreamSep::operator<<(&local_78,(char (*) [20])" > end_m1 ) goto l_");
    iVar2 = Instruction::get_id_gen
                      ((this->super_Instruction).next.
                       super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].inst,cpp_emitter);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (this_00->stream,(this_00->sep)._M_dataplus._M_p,
                        (this_00->sep)._M_string_length);
    std::ostream::operator<<((ostream *)poVar3,iVar2);
    StreamSep::operator<<(this_00,(char (*) [2])0x17d5c3);
    StreamSep::~StreamSep(&local_78);
    StreamSepMaker::operator<<(&local_78,ss,(char (*) [9])0x17de66);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_78.stream,local_78.sep._M_dataplus._M_p,local_78.sep._M_string_length)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    StreamSep::operator<<(&local_78,(char (*) [2])0x17d5c3);
  }
  StreamSep::~StreamSep(&local_78);
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionTestContiguous::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( next.size() == 1 ) {
        ss << "data += " << nb_chars - beg << ";";
        return write_trans( ss, cpp_emitter );
    }
    
    if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( next[ 1 ].inst->num_ordering != num_ordering + 1 )
            ss << "goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
    } else {
        ss << "if ( data + " << nb_chars - beg << " > end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "data += " << nb_chars - beg << ";";
        write_trans( ss, cpp_emitter );
    }
}